

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfVecAttribute.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Vec3<double>_>::readValueFrom
          (TypedAttribute<Imath_2_5::Vec3<double>_> *this,IStream *is,int size,int version)

{
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,&(this->_value).x);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,&(this->_value).y);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,&(this->_value).z);
  return;
}

Assistant:

void
V3dAttribute::readValueFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int size, int version)
{
    Xdr::read <StreamIO> (is, _value.x);
    Xdr::read <StreamIO> (is, _value.y);
    Xdr::read <StreamIO> (is, _value.z);
}